

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitMathBuiltin
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,AsmJsMathFunction *mathFunction)

{
  ushort argCount;
  AsmJsFunc *this_00;
  code *pcVar1;
  AsmJSByteCodeGenerator *pAVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ArgSlot AVar6;
  RegSlot R0;
  uint R0_00;
  AsmJsType AVar7;
  RegSlot R1;
  EmitExpressionInfo EVar8;
  ParseNodeCall *pPVar9;
  ulong count;
  ParseNodeFloat *pPVar10;
  Memory *pMVar11;
  AsmJsType *ptr;
  EmitExpressionInfo *ptr_00;
  ParseNode *pPVar12;
  ParseNode *node;
  ParseNodeInt *pPVar13;
  undefined4 *puVar14;
  AsmJsCompilationException *pAVar15;
  long lVar16;
  AsmJsMathFunction *pAVar17;
  long lVar18;
  AsmJsByteCodeWriter *this_01;
  ArgSlot i;
  ulong uVar19;
  float val;
  undefined1 local_b0 [8];
  AsmJsRetType retType;
  AutoArrayPtr<Js::AsmJsType> local_88;
  AsmJsRetType local_74;
  ParseNode *local_70;
  AsmJsMathFunction *local_68;
  AsmJsType local_5c;
  AutoArrayPtr<Js::EmitExpressionInfo> local_58;
  OpCodeAsmJs local_3a;
  AsmJSByteCodeGenerator *pAStack_38;
  OpCodeAsmJs op;
  
  if ((mathFunction->mBuiltIn & ~AsmJSMathBuiltin_cos) == AsmJSMathBuiltin_min) {
    EVar8 = EmitMinMax(this,pnode,mathFunction);
    pAVar17 = (AsmJsMathFunction *)((ulong)EVar8 >> 0x20);
  }
  else {
    pAStack_38 = this;
    pPVar9 = ParseNode::AsParseNodeCall(pnode);
    argCount = pPVar9->argCount;
    count = (ulong)argCount;
    local_70 = pnode;
    pPVar9 = ParseNode::AsParseNodeCall(pnode);
    node = pPVar9->pnodeArgs;
    local_68 = mathFunction;
    bVar3 = AsmJsMathFunction::IsFround(&mathFunction->super_AsmJsFunctionDeclaration);
    if ((argCount == 1 && bVar3) &&
       (bVar4 = ParserWrapper::IsFroundNumericLiteral(node), pAVar2 = pAStack_38, pPVar12 = local_70
       , bVar4)) {
      StartStatement(pAStack_38,local_70);
      R0 = AsmJsFunc::AcquireTmpRegister<float>(pAVar2->mFunction);
      EVar8.type.which_ = Int;
      EVar8.super_EmitInfoBase.location = R0;
      if (node->nop == knopInt) {
        pPVar13 = ParseNode::AsParseNodeInt(node);
        val = (float)pPVar13->lw;
      }
      else if (node->nop == knopFlt) {
        pPVar10 = ParseNode::AsParseNodeFloat(node);
        val = (float)pPVar10->dbl;
      }
      else {
        bVar3 = ParserWrapper::IsNegativeZero(node);
        val = -0.0;
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                      ,0x4a1,"(ParserWrapper::IsNegativeZero(argNode))",
                                      "ParserWrapper::IsNegativeZero(argNode)");
          if (!bVar3) goto LAB_00867044;
          *puVar14 = 0;
          val = -0.0;
          pPVar12 = local_70;
        }
      }
      pAVar17 = (AsmJsMathFunction *)0x3;
      this_01 = &pAStack_38->mWriter;
      R1 = AsmJsFunc::GetConstRegister<float>(pAStack_38->mFunction,val);
      AsmJsByteCodeWriter::AsmReg2(this_01,Ld_Flt,R0,R1);
      ByteCodeWriter::EndStatement(&this_01->super_ByteCodeWriter,pPVar12);
      goto LAB_00866f0c;
    }
    local_88.super_BasePtr<Js::AsmJsType>.ptr = (AsmJsType *)0x0;
    local_88.m_elementCount = 0;
    local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr = (EmitExpressionInfo *)0x0;
    local_58.m_elementCount = 0;
    if (argCount != 0) {
      local_b0 = (undefined1  [8])&AsmJsType::typeinfo;
      _retType = 0;
      pMVar11 = (Memory *)
                Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
      ptr = Memory::AllocateArray<Memory::HeapAllocator,Js::AsmJsType,false>
                      (pMVar11,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,count);
      AutoArrayPtr<Js::AsmJsType>::Set(&local_88,ptr,(uint)argCount);
      local_b0 = (undefined1  [8])&EmitExpressionInfo::typeinfo;
      _retType = 0;
      pMVar11 = (Memory *)
                Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
      ptr_00 = Memory::AllocateArray<Memory::HeapAllocator,Js::EmitExpressionInfo,false>
                         (pMVar11,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,count);
      AutoArrayPtr<Js::EmitExpressionInfo>::Set(&local_58,ptr_00,(uint)argCount);
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        if (node->nop != knopCall || !bVar3) {
          pPVar12 = node;
          if (node->nop == knopList) {
            pPVar12 = ParserWrapper::GetBinaryLeft(node);
            node = ParserWrapper::GetBinaryRight(node);
          }
          EVar8 = Emit(pAStack_38,pPVar12);
        }
        else {
          AsmJsRetType::AsmJsRetType(&local_74,Float);
          EVar8 = EmitCall(pAStack_38,node,local_74);
        }
        local_88.super_BasePtr<Js::AsmJsType>.ptr[uVar19].which_ = EVar8.type.which_.which_;
        local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[uVar19] = EVar8;
      }
    }
    pAVar2 = pAStack_38;
    StartStatement(pAStack_38,local_70);
    AsmJsRetType::AsmJsRetType((AsmJsRetType *)local_b0);
    bVar3 = AsmJsMathFunction::SupportsMathCall
                      (local_68,argCount,local_88.super_BasePtr<Js::AsmJsType>.ptr,&local_3a,
                       (AsmJsRetType *)local_b0);
    if (!bVar3) {
      pAVar15 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar15,L"Math builtin function doesn\'t support arguments");
      __cxa_throw(pAVar15,&AsmJsCompilationException::typeinfo,0);
    }
    lVar16 = count + 1;
    lVar18 = count * 8;
    while( true ) {
      if (lVar16 + -1 == 0 || lVar16 < 1) break;
      AsmJsFunc::ReleaseLocationGeneric
                (pAVar2->mFunction,
                 (EmitExpressionInfo *)
                 ((long)&local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[-1].super_EmitInfoBase.
                         location + lVar18));
      lVar16 = lVar16 + -1;
      lVar18 = lVar18 + -8;
    }
    AVar6 = AsmJsFunctionDeclaration::GetArgByteSize
                      (&local_68->super_AsmJsFunctionDeclaration,argCount);
    AsmJsFunc::UpdateMaxArgOutDepth(pAVar2->mFunction,(AVar6 + 8 >> 3) + 2);
    local_5c = AsmJsRetType::toType((AsmJsRetType *)local_b0);
    bVar3 = AsmJsType::isInt(&local_5c);
    local_5c = AsmJsRetType::toType((AsmJsRetType *)local_b0);
    bVar4 = AsmJsType::isFloatish(&local_5c);
    if (!bVar3 && !bVar4) {
      local_5c = AsmJsRetType::toType((AsmJsRetType *)local_b0);
      bVar5 = AsmJsType::isDouble(&local_5c);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x4e5,"(isInt || isFloatish || retType.toType().isDouble())",
                                    "isInt || isFloatish || retType.toType().isDouble()");
        if (!bVar5) goto LAB_00867044;
        *puVar14 = 0;
      }
    }
    this_00 = pAStack_38->mFunction;
    if (bVar3) {
      R0_00 = AsmJsFunc::AcquireTmpRegister<int>(this_00);
    }
    else if (bVar4) {
      R0_00 = AsmJsFunc::AcquireTmpRegister<float>(this_00);
    }
    else {
      R0_00 = AsmJsFunc::AcquireTmpRegister<double>(this_00);
    }
    pAVar2 = pAStack_38;
    EVar8.type.which_ = Int;
    EVar8.super_EmitInfoBase.location = R0_00;
    AVar7 = AsmJsRetType::toType((AsmJsRetType *)local_b0);
    if (count == 1) {
      AsmJsByteCodeWriter::AsmReg2
                (&pAVar2->mWriter,local_3a,R0_00,
                 ((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->super_EmitInfoBase).location
                );
    }
    else if (argCount == 2) {
      AsmJsByteCodeWriter::AsmReg3
                (&pAVar2->mWriter,local_3a,R0_00,
                 ((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->super_EmitInfoBase).location
                 ,local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[1].super_EmitInfoBase.location)
      ;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x500,"((0))","(0)");
      if (!bVar3) {
LAB_00867044:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar14 = 0;
    }
    local_68 = (AsmJsMathFunction *)(ulong)AVar7.which_;
    for (lVar18 = 0; (ulong)argCount << 3 != lVar18; lVar18 = lVar18 + 8) {
      bVar3 = AsmJsType::isSubType
                        ((AsmJsType *)
                         ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).which_
                         + lVar18),(AsmJsType)0x7);
      if (bVar3) {
        bVar3 = AsmJsFunc::IsValidLocation<float>
                          (pAStack_38->mFunction,
                           (EmitExpressionInfo *)
                           ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                   super_EmitInfoBase).location + lVar18));
        if (!bVar3) {
          pAVar15 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar15,L"Invalid Node location[%d] ",
                     (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                             super_EmitInfoBase).location + lVar18));
          goto LAB_00867004;
        }
      }
      else {
        bVar3 = AsmJsType::isSubType
                          ((AsmJsType *)
                           ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).
                                   which_ + lVar18),(AsmJsType)0x4);
        if (bVar3) {
          bVar3 = AsmJsFunc::IsValidLocation<double>
                            (pAStack_38->mFunction,
                             (EmitExpressionInfo *)
                             ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                     super_EmitInfoBase).location + lVar18));
          if (!bVar3) {
            pAVar15 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar15,L"Invalid Node location[%d] ",
                       (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)
                                               ->super_EmitInfoBase).location + lVar18));
LAB_00867004:
            __cxa_throw(pAVar15,&AsmJsCompilationException::typeinfo,0);
          }
        }
        else {
          bVar3 = AsmJsType::isSubType
                            ((AsmJsType *)
                             ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).
                                     which_ + lVar18),(AsmJsType)0xc);
          if ((bVar3) &&
             (bVar3 = AsmJsFunc::IsValidLocation<int>
                                (pAStack_38->mFunction,
                                 (EmitExpressionInfo *)
                                 ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                         super_EmitInfoBase).location + lVar18)), !bVar3)) {
            pAVar15 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar15,L"Invalid Node location[%d] ",
                       (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)
                                               ->super_EmitInfoBase).location + lVar18));
            goto LAB_00867004;
          }
        }
      }
    }
    ByteCodeWriter::EndStatement(&(pAStack_38->mWriter).super_ByteCodeWriter,local_70);
    pAVar17 = local_68;
    AutoArrayPtr<Js::EmitExpressionInfo>::~AutoArrayPtr(&local_58);
    AutoArrayPtr<Js::AsmJsType>::~AutoArrayPtr(&local_88);
  }
LAB_00866f0c:
  return (EmitExpressionInfo)((ulong)EVar8 & 0xffffffff | (long)pAVar17 << 0x20);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitMathBuiltin(ParseNode* pnode, AsmJsMathFunction* mathFunction)
    {
        if (mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_max || mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_min)
        {
            return EmitMinMax(pnode, mathFunction);
        }

        const ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
        ParseNode* argNode = pnode->AsParseNodeCall()->pnodeArgs;
        const bool isFRound = AsmJsMathFunction::IsFround(mathFunction);

        // for fround, if we have a fround(NumericLiteral), we want to just emit Ld_Flt NumericLiteral
        if (argCount == 1 && isFRound && ParserWrapper::IsFroundNumericLiteral(argNode))
        {
            StartStatement(pnode);
            RegSlot dst = mFunction->AcquireTmpRegister<float>();
            EmitExpressionInfo emitInfo(dst, AsmJsType::Float);
            float constValue = -0.0f;
            if (argNode->nop == knopFlt)
            {
                constValue = (float)argNode->AsParseNodeFloat()->dbl;
            }
            else if (argNode->nop == knopInt)
            {
                constValue = (float)argNode->AsParseNodeInt()->lw;
            }
            else
            {
                Assert(ParserWrapper::IsNegativeZero(argNode));
            }
            mWriter.AsmReg2(OpCodeAsmJs::Ld_Flt, dst, mFunction->GetConstRegister<float>(constValue));
            EndStatement(pnode);
            return emitInfo;
        }

        AutoArrayPtr<AsmJsType> types(nullptr, 0);
        AutoArrayPtr<EmitExpressionInfo> argsInfo(nullptr, 0);
        if( argCount > 0 )
        {
            types.Set(HeapNewArray(AsmJsType, argCount), argCount);
            argsInfo.Set(HeapNewArray(EmitExpressionInfo, argCount), argCount);

            for(ArgSlot i = 0; i < argCount; i++)
            {
                // Get i arg node
                ParseNode* arg = argNode;
                // Special case for fround(abs()) call
                if (argNode->nop == knopCall && isFRound)
                {
                    // Emit argument
                    const EmitExpressionInfo& argInfo = EmitCall(arg, AsmJsRetType::Float);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
                else
                {
                    if (argNode->nop == knopList)
                    {
                        arg = ParserWrapper::GetBinaryLeft(argNode);
                        argNode = ParserWrapper::GetBinaryRight(argNode);
                    }
                    // Emit argument
                    const EmitExpressionInfo& argInfo = Emit(arg);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
            }
        }
        StartStatement(pnode);
        // Check if this function supports the type of these arguments
        AsmJsRetType retType;
        OpCodeAsmJs op;
        const bool supported = mathFunction->SupportsMathCall( argCount, types, op, retType );
        if( !supported )
        {
            throw AsmJsCompilationException( _u("Math builtin function doesn't support arguments") );
        }

        // Release all used location before acquiring a new tmp register
        for (int i = argCount - 1; i >= 0 ; i--)
        {
            mFunction->ReleaseLocationGeneric( &argsInfo[i] );
        }

        const int argByteSize = mathFunction->GetArgByteSize(argCount) + sizeof(Var);
        // + 1 is for function object
        int runtimeArg = (int)(::ceil((double)(argByteSize / sizeof(Var)))) + 1;

        // Make sure we have enough memory allocated for OutParameters
        // + 1 for return address
        mFunction->UpdateMaxArgOutDepth(runtimeArg + 1);

        const bool isInt = retType.toType().isInt();
        const bool isFloatish = retType.toType().isFloatish();
        Assert(isInt || isFloatish || retType.toType().isDouble());

        RegSlot dst;
        if( isInt )
        {
            dst = mFunction->AcquireTmpRegister<int>();
        }
        else if (isFloatish)
        {
            dst = mFunction->AcquireTmpRegister<float>();
        }
        else
        {
            dst = mFunction->AcquireTmpRegister<double>();
        }

        EmitExpressionInfo emitInfo(dst, retType.toType());

        switch( argCount )
        {
        case 1:
            mWriter.AsmReg2( op, dst, argsInfo[0].location );
            break;
        case 2:
            mWriter.AsmReg3( op, dst, argsInfo[0].location, argsInfo[1].location );
            break;
        default:
            Assume(UNREACHED);
        }
#if DBG
        for (int i = 0; i < argCount; i++)
        {
            if (argsInfo[i].type.isSubType(AsmJsType::Floatish))
            {
                CheckNodeLocation(argsInfo[i], float);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::MaybeDouble))
            {
                CheckNodeLocation(argsInfo[i], double);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::Intish))
            {
                CheckNodeLocation(argsInfo[i], int);
            }
        }
#endif
        EndStatement(pnode);
        return emitInfo;
    }